

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,int *key)

{
  EntryType *freeEntry;
  uint uVar1;
  Type piVar2;
  uint uVar3;
  Type pSVar4;
  int *piVar5;
  ulong uVar6;
  uint depth;
  uint uVar7;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 != (Type)0x0) {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar1 = piVar2[uVar3];
    uVar6 = (ulong)(int)uVar1;
    depth = 0;
    if (-1 < (long)uVar6) {
      pSVar4 = this->entries;
      if (pSVar4[uVar6].
          super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
          super_KeyValueEntry<int,_bool>.
          super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
          .super_KeyValueEntryDataLayout2<int,_bool>.key == *key) {
        depth = 0;
        uVar7 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar7 = uVar1;
          depth = depth + 1;
          uVar1 = pSVar4[uVar7].
                  super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
                  super_KeyValueEntry<int,_bool>.
                  super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                  .super_KeyValueEntryDataLayout2<int,_bool>.next;
          uVar6 = (ulong)(int)uVar1;
          if ((long)uVar6 < 0) goto LAB_00cfed33;
        } while (pSVar4[uVar6].
                 super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
                 super_KeyValueEntry<int,_bool>.
                 super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                 .super_KeyValueEntryDataLayout2<int,_bool>.key != *key);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
        pSVar4 = this->entries;
      }
      freeEntry = pSVar4 + (uVar6 & 0xffffffff);
      piVar5 = &pSVar4[uVar7].
                super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
                super_KeyValueEntry<int,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                .super_KeyValueEntryDataLayout2<int,_bool>.next;
      if ((int)uVar7 < 0) {
        piVar5 = this->buckets + uVar3;
      }
      *piVar5 = (freeEntry->
                super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>).
                super_KeyValueEntry<int,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                .super_KeyValueEntryDataLayout2<int,_bool>.next;
      (freeEntry->super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>)
      .super_KeyValueEntry<int,_bool>.
      super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>.
      super_KeyValueEntryDataLayout2<int,_bool>.value = false;
      (freeEntry->super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>)
      .super_KeyValueEntry<int,_bool>.
      super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>.
      super_KeyValueEntryDataLayout2<int,_bool>.key = 0;
      SetNextFreeEntryIndex(this,freeEntry,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = (Type)uVar6;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,this->buckets[uVar3] == -1);
      return true;
    }
  }
LAB_00cfed33:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }